

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  int iVar1;
  unsigned_short *puVar2;
  bool bVar3;
  int iVar4;
  unsigned_short *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  iVar1 = obj->CurLenW;
  if (iVar1 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                  ,0xe00,
                  "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                 );
  }
  uVar8 = obj->UserFlags;
  lVar10 = (long)new_text_len;
  iVar4 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar10);
  if (((uVar8 >> 0x12 & 1) == 0) && (obj->BufCapacityA <= obj->CurLenA + iVar4)) {
LAB_0017b462:
    bVar3 = false;
  }
  else {
    iVar6 = (obj->TextW).Size;
    if (iVar6 <= new_text_len + iVar1) {
      if ((uVar8 >> 0x12 & 1) == 0) goto LAB_0017b462;
      if (iVar6 <= iVar1) {
        __assert_fail("text_len < obj->TextW.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xe0b,
                      "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                     );
      }
      iVar6 = 0x100;
      if (0x100 < new_text_len) {
        iVar6 = new_text_len;
      }
      if (new_text_len * 4 < iVar6) {
        iVar6 = new_text_len * 4;
      }
      iVar7 = 0x20;
      if (7 < new_text_len) {
        iVar7 = iVar6;
      }
      iVar9 = iVar7 + iVar1 + 1;
      iVar6 = (obj->TextW).Capacity;
      if (iVar6 <= iVar7 + iVar1) {
        if (iVar6 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar6 / 2 + iVar6;
        }
        if (iVar7 <= iVar9) {
          iVar7 = iVar9;
        }
        if (iVar6 < iVar7) {
          puVar5 = (unsigned_short *)ImGui::MemAlloc((long)iVar7 * 2);
          puVar2 = (obj->TextW).Data;
          if (puVar2 != (unsigned_short *)0x0) {
            memcpy(puVar5,puVar2,(long)(obj->TextW).Size * 2);
            ImGui::MemFree((obj->TextW).Data);
          }
          (obj->TextW).Data = puVar5;
          (obj->TextW).Capacity = iVar7;
        }
      }
      (obj->TextW).Size = iVar9;
    }
    puVar2 = (obj->TextW).Data;
    if (iVar1 - pos != 0) {
      puVar5 = puVar2 + pos;
      memmove(puVar5 + lVar10,puVar5,(long)(iVar1 - pos) * 2);
    }
    memcpy(puVar2 + pos,new_text,lVar10 * 2);
    obj->Edited = true;
    obj->CurLenA = obj->CurLenA + iVar4;
    uVar8 = new_text_len + obj->CurLenW;
    obj->CurLenW = uVar8;
    if (((int)uVar8 < 0) || ((obj->TextW).Size <= (int)uVar8)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                    ,0x65c,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
    }
    (obj->TextW).Data[uVar8] = 0;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}